

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int test_describe_history_monitor_values(void)

{
  code *pcVar1;
  char *__s;
  OcsDescribeHistoryMonitorValuesRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_229;
  int ret;
  HttpTestListener *local_208;
  HttpTestListener *listener;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [55];
  allocator<char> local_171;
  string local_170 [32];
  OcsDescribeHistoryMonitorValuesRequestType *local_150;
  Ocs *ocs;
  OcsDescribeHistoryMonitorValuesResponseType resp;
  OcsDescribeHistoryMonitorValuesRequestType req;
  
  aliyun::OcsDescribeHistoryMonitorValuesRequestType::OcsDescribeHistoryMonitorValuesRequestType
            ((OcsDescribeHistoryMonitorValuesRequestType *)((long)&resp.monitor_history.field_2 + 8)
            );
  aliyun::OcsDescribeHistoryMonitorValuesResponseType::OcsDescribeHistoryMonitorValuesResponseType
            ((OcsDescribeHistoryMonitorValuesResponseType *)&ocs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"cn-hangzhou",&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a8,"my_appid",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"my_secret",&local_1d1);
  pOVar2 = (OcsDescribeHistoryMonitorValuesRequestType *)
           aliyun::Ocs::CreateOcsClient(local_170,local_1a8,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  local_150 = pOVar2;
  if (pOVar2 == (OcsDescribeHistoryMonitorValuesRequestType *)0x0) {
    aliyun::OcsDescribeHistoryMonitorValuesResponseType::
    ~OcsDescribeHistoryMonitorValuesResponseType
              ((OcsDescribeHistoryMonitorValuesResponseType *)&ocs);
    aliyun::OcsDescribeHistoryMonitorValuesRequestType::~OcsDescribeHistoryMonitorValuesRequestType
              ((OcsDescribeHistoryMonitorValuesRequestType *)
               ((long)&resp.monitor_history.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetProxyHost((Ocs *)pOVar2,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Ocs::SetUseTls((Ocs *)local_150,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_history_monitor_values_response;
  local_208 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_229);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_229);
  HttpTestListener::Start(local_208);
  std::__cxx11::string::operator=
            ((string *)(resp.monitor_history.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  std::__cxx11::string::operator=
            ((string *)(req.instance_id.field_2._M_local_buf + 8),"MonitorKeys");
  std::__cxx11::string::operator=((string *)(req.monitor_keys.field_2._M_local_buf + 8),"StartTime")
  ;
  std::__cxx11::string::operator=((string *)(req.start_time.field_2._M_local_buf + 8),"EndTime");
  std::__cxx11::string::operator=
            ((string *)(req.end_time.field_2._M_local_buf + 8),"IntervalForHistory");
  aliyun::Ocs::DescribeHistoryMonitorValues
            (local_150,
             (OcsDescribeHistoryMonitorValuesResponseType *)
             ((long)&resp.monitor_history.field_2 + 8),(OcsErrorInfo *)&ocs);
  HttpTestListener::WaitComplete(local_208);
  pHVar3 = local_208;
  if (local_208 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_208);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_150;
  if (local_150 != (OcsDescribeHistoryMonitorValuesRequestType *)0x0) {
    aliyun::Ocs::~Ocs((Ocs *)local_150);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_history_monitor_values() {
  OcsDescribeHistoryMonitorValuesRequestType req;
  OcsDescribeHistoryMonitorValuesResponseType resp;
  Ocs* ocs = Ocs::CreateOcsClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ocs) return 0;
  ocs->SetProxyHost("127.0.0.1:12234");
  ocs->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_history_monitor_values_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  req.monitor_keys = "MonitorKeys";
  req.start_time = "StartTime";
  req.end_time = "EndTime";
  req.interval_for_history = "IntervalForHistory";
  int ret = ocs->DescribeHistoryMonitorValues(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ocs;
}